

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *window_00;
  
  pIVar1 = GImGui;
  window = GImGui->HoveredWindow;
  if (window == (ImGuiWindow *)0x0) {
    return false;
  }
  if ((flags & 4U) == 0) {
    window_00 = GImGui->CurrentWindow;
    if ((flags & 2U) != 0) {
      window_00 = GetCombinedRootWindow(window_00,(flags & 8U) == 0);
    }
    if ((flags & 1U) == 0) {
      if (window != window_00) {
        return false;
      }
    }
    else {
      bVar2 = IsWindowChildOf(window,window_00,(flags & 8U) == 0);
      if (!bVar2) {
        return false;
      }
    }
  }
  bVar2 = IsWindowContentHoverable(window,flags);
  if ((bVar2) &&
     (((((char)flags < '\0' || (pIVar1->ActiveId == 0)) || (pIVar1->ActiveIdAllowOverlap != false))
      || (pIVar1->ActiveId == window->MoveId)))) {
    if (((uint)flags >> 0xc & 1) != 0) {
      flags = flags | (pIVar1->Style).HoverFlagsForTooltipMouse;
    }
    if ((((uint)flags >> 0xd & 1) == 0) || (pIVar1->HoverWindowUnlockedStationaryId == window->ID))
    {
      return true;
    }
  }
  return false;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & ~ImGuiHoveredFlags_AllowedMaskForIsWindowHovered) == 0 && "Invalid flags for IsWindowHovered()!");

    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.HoveredWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;
    if (ref_window == NULL)
        return false;

    if ((flags & ImGuiHoveredFlags_AnyWindow) == 0)
    {
        IM_ASSERT(cur_window); // Not inside a Begin()/End()
        const bool popup_hierarchy = (flags & ImGuiHoveredFlags_NoPopupHierarchy) == 0;
        if (flags & ImGuiHoveredFlags_RootWindow)
            cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy);

        bool result;
        if (flags & ImGuiHoveredFlags_ChildWindows)
            result = IsWindowChildOf(ref_window, cur_window, popup_hierarchy);
        else
            result = (ref_window == cur_window);
        if (!result)
            return false;
    }

    if (!IsWindowContentHoverable(ref_window, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != ref_window->MoveId)
            return false;

    // When changing hovered window we requires a bit of stationary delay before activating hover timer.
    // FIXME: We don't support delay other than stationary one for now, other delay would need a way
    // to fulfill the possibility that multiple IsWindowHovered() with varying flag could return true
    // for different windows of the hierarchy. Possibly need a Hash(Current+Flags) ==> (Timer) cache.
    // We can implement this for _Stationary because the data is linked to HoveredWindow rather than CurrentWindow.
    if (flags & ImGuiHoveredFlags_ForTooltip)
        flags = ApplyHoverFlagsForTooltip(flags, g.Style.HoverFlagsForTooltipMouse);
    if ((flags & ImGuiHoveredFlags_Stationary) != 0 && g.HoverWindowUnlockedStationaryId != ref_window->ID)
        return false;

    return true;
}